

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexgenerator.cpp
# Opt level: O2

size_t meshopt_generateVertexRemap
                 (uint *destination,uint *indices,size_t index_count,void *vertices,
                 size_t vertex_count,size_t vertex_size)

{
  uint uVar1;
  uint uVar2;
  size_t size;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  size_t i;
  size_t sVar6;
  uint index;
  VertexHasher hasher;
  meshopt_Allocator allocator;
  uint local_120;
  uint local_11c;
  uint *local_118;
  VertexHasher local_110;
  meshopt_Allocator local_f8;
  
  uVar1 = 0;
  memset(&local_f8,0,200);
  memset(destination,0xff,vertex_count * 4);
  local_110.vertices = (uchar *)vertices;
  local_110.vertex_size = vertex_size;
  local_110.vertex_stride = vertex_size;
  size = meshopt::hashBuckets(vertex_count);
  local_118 = meshopt_Allocator::allocate<unsigned_int>(&local_f8,size);
  memset(local_118,0xff,size << 2);
  for (sVar6 = 0; index_count != sVar6; sVar6 = sVar6 + 1) {
    if (indices == (uint *)0x0) {
      uVar5 = (uint)sVar6;
    }
    else {
      uVar5 = indices[sVar6];
    }
    local_11c = uVar5;
    if (destination[uVar5] == 0xffffffff) {
      local_120 = 0xffffffff;
      puVar3 = meshopt::hashLookup<unsigned_int,meshopt::VertexHasher>
                         (local_118,size,&local_110,&local_11c,&local_120);
      if ((ulong)*puVar3 == 0xffffffff) {
        *puVar3 = uVar5;
        uVar4 = uVar1 + 1;
        uVar2 = uVar1;
      }
      else {
        uVar2 = destination[*puVar3];
        uVar4 = uVar1;
      }
      destination[uVar5] = uVar2;
      uVar1 = uVar4;
    }
  }
  meshopt_Allocator::~meshopt_Allocator(&local_f8);
  return (ulong)uVar1;
}

Assistant:

size_t meshopt_generateVertexRemap(unsigned int* destination, const unsigned int* indices, size_t index_count, const void* vertices, size_t vertex_count, size_t vertex_size)
{
	using namespace meshopt;

	assert(indices || index_count == vertex_count);
	assert(index_count % 3 == 0);
	assert(vertex_size > 0 && vertex_size <= 256);

	meshopt_Allocator allocator;

	memset(destination, -1, vertex_count * sizeof(unsigned int));

	VertexHasher hasher = {static_cast<const unsigned char*>(vertices), vertex_size, vertex_size};

	size_t table_size = hashBuckets(vertex_count);
	unsigned int* table = allocator.allocate<unsigned int>(table_size);
	memset(table, -1, table_size * sizeof(unsigned int));

	unsigned int next_vertex = 0;

	for (size_t i = 0; i < index_count; ++i)
	{
		unsigned int index = indices ? indices[i] : unsigned(i);
		assert(index < vertex_count);

		if (destination[index] == ~0u)
		{
			unsigned int* entry = hashLookup(table, table_size, hasher, index, ~0u);

			if (*entry == ~0u)
			{
				*entry = index;

				destination[index] = next_vertex++;
			}
			else
			{
				assert(destination[*entry] != ~0u);

				destination[index] = destination[*entry];
			}
		}
	}

	assert(next_vertex <= vertex_count);

	return next_vertex;
}